

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNClosure * __thiscall
Centaurus::CompositeATN<unsigned_char>::build_closure
          (CATNClosure *__return_storage_ptr__,CompositeATN<unsigned_char> *this,ATNPath *path,
          int color)

{
  int color_00;
  PriorityChain local_70;
  undefined1 local_48 [8];
  ATNStateStack stack;
  int color_local;
  ATNPath *path_local;
  CompositeATN<unsigned_char> *this_local;
  CATNClosure *closure;
  
  stack.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  stack.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = color;
  std::
  set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  ::set(__return_storage_ptr__);
  ATNPath::ATNPath((ATNPath *)local_48);
  color_00 = stack.
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             .
             super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  PriorityChain::PriorityChain(&local_70);
  build_closure_inclusive
            (this,__return_storage_ptr__,path,color_00,(ATNStateStack *)local_48,&local_70);
  PriorityChain::~PriorityChain(&local_70);
  stack.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  ATNPath::~ATNPath((ATNPath *)local_48);
  if ((stack.
       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
       .
       super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
    std::
    set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
    ::~set(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

CATNClosure build_closure(const ATNPath& path, int color) const
    {
        CATNClosure closure;

        ATNStateStack stack;

        build_closure_inclusive(closure, path, color, stack, PriorityChain());

        return closure;
    }